

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Value * soul::AST::TypeMetaFunction::performOp(Value *__return_storage_ptr__,Op op,Type *sourceType)

{
  bool v;
  BoundedIntSize BVar1;
  ArraySize v_00;
  
  if (op == size) {
    if ((sourceType->category & ~primitive) == wrap) {
      BVar1 = Type::getBoundedIntLimit(sourceType);
      v_00 = (ArraySize)BVar1;
    }
    else {
      v_00 = Type::getArrayOrVectorSize(sourceType);
    }
    soul::Value::Value(__return_storage_ptr__,v_00);
  }
  else {
    v = performBoolOp(op,sourceType);
    soul::Value::Value(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value performOp (Op op, const Type& sourceType)
        {
            if (op == Op::size)
                return Value::createInt64 (sourceType.isBoundedInt() ? (uint64_t) sourceType.getBoundedIntLimit()
                                                                     : (uint64_t) sourceType.getArrayOrVectorSize());

            return Value (performBoolOp (op, sourceType));
        }